

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O0

cmValue __thiscall
cmStandardLevelResolver::CompileFeaturesAvailable
          (cmStandardLevelResolver *this,string *lang,string *error)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmGlobalGenerator *this_00;
  ostream *poVar3;
  string *psVar4;
  string local_478;
  string local_458 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  undefined1 local_3b8 [8];
  ostringstream e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  cmValue local_1f8;
  cmValue featuresKnown;
  string local_1d0 [48];
  undefined1 local_1a0 [8];
  ostringstream e;
  string *error_local;
  string *lang_local;
  cmStandardLevelResolver *this_local;
  
  this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(this_00,lang);
  if (bVar2) {
    pcVar1 = this->Makefile;
    std::operator+(&local_238,"CMAKE_",lang);
    std::operator+(&local_218,&local_238,"_COMPILE_FEATURES");
    local_1f8 = cmMakefile::GetDefinition(pcVar1,&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    bVar2 = cmNonempty(local_1f8);
    if (bVar2) {
      this_local = (cmStandardLevelResolver *)local_1f8.Value;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
      if (error == (string *)0x0) {
        std::operator<<((ostream *)local_3b8,"No");
      }
      else {
        std::operator<<((ostream *)local_3b8,"no");
      }
      poVar3 = std::operator<<((ostream *)local_3b8," known features for ");
      poVar3 = std::operator<<(poVar3,(string *)lang);
      poVar3 = std::operator<<(poVar3," compiler\n\"");
      pcVar1 = this->Makefile;
      std::operator+(&local_3f8,"CMAKE_",lang);
      std::operator+(&local_3d8,&local_3f8,"_COMPILER_ID");
      psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_3d8);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,"\"\nversion ");
      pcVar1 = this->Makefile;
      std::operator+(&local_438,"CMAKE_",lang);
      std::operator+(&local_418,&local_438,"_COMPILER_VERSION");
      psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_418);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::operator<<(poVar3,".");
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3f8);
      if (error == (string *)0x0) {
        pcVar1 = this->Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_478);
        std::__cxx11::string::~string((string *)&local_478);
      }
      else {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)error,local_458);
        std::__cxx11::string::~string(local_458);
      }
      cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    if (error == (string *)0x0) {
      std::operator<<((ostream *)local_1a0,"Cannot");
    }
    else {
      std::operator<<((ostream *)local_1a0,"cannot");
    }
    poVar3 = std::operator<<((ostream *)local_1a0," use features from non-enabled language ");
    std::operator<<(poVar3,(string *)lang);
    if (error == (string *)0x0) {
      pcVar1 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&featuresKnown);
      std::__cxx11::string::~string((string *)&featuresKnown);
    }
    else {
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)error,local_1d0);
      std::__cxx11::string::~string(local_1d0);
    }
    cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  }
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmStandardLevelResolver::CompileFeaturesAvailable(
  const std::string& lang, std::string* error) const
{
  if (!this->Makefile->GetGlobalGenerator()->GetLanguageEnabled(lang)) {
    std::ostringstream e;
    if (error) {
      e << "cannot";
    } else {
      e << "Cannot";
    }
    e << " use features from non-enabled language " << lang;
    if (error) {
      *error = e.str();
    } else {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return nullptr;
  }

  cmValue featuresKnown =
    this->Makefile->GetDefinition("CMAKE_" + lang + "_COMPILE_FEATURES");

  if (!cmNonempty(featuresKnown)) {
    std::ostringstream e;
    if (error) {
      e << "no";
    } else {
      e << "No";
    }
    e << " known features for " << lang << " compiler\n\""
      << this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID")
      << "\"\nversion "
      << this->Makefile->GetSafeDefinition("CMAKE_" + lang +
                                           "_COMPILER_VERSION")
      << ".";
    if (error) {
      *error = e.str();
    } else {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return nullptr;
  }
  return featuresKnown;
}